

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall
args::ValueFlagList<int,_args::detail::vector,_args::ValueReader>::~ValueFlagList
          (ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this)

{
  ~ValueFlagList(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ValueFlagList() {}